

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O2

TemporalBinInfo *
embree::sse2::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::RecalculatePrimRef<embree::QuadMesh>,_2UL>
::TemporalBinInfo::merge2
          (TemporalBinInfo *__return_storage_ptr__,TemporalBinInfo *a,TemporalBinInfo *b)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  size_t sVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  
  TemporalBinInfo(__return_storage_ptr__,a);
  aVar4 = __return_storage_ptr__->bounds0[0].bounds0.lower.field_0;
  aVar1 = __return_storage_ptr__->bounds0[0].bounds0.upper.field_0;
  sVar3 = b->count1[0];
  aVar2 = __return_storage_ptr__->bounds0[0].bounds1.lower.field_0;
  __return_storage_ptr__->count0[0] = __return_storage_ptr__->count0[0] + b->count0[0];
  __return_storage_ptr__->count1[0] = __return_storage_ptr__->count1[0] + sVar3;
  aVar4.m128 = (__m128)minps(aVar4.m128,b->bounds0[0].bounds0.lower.field_0);
  __return_storage_ptr__->bounds0[0].bounds0.lower.field_0 = aVar4;
  aVar4.m128 = (__m128)maxps(aVar1.m128,b->bounds0[0].bounds0.upper.field_0);
  __return_storage_ptr__->bounds0[0].bounds0.upper.field_0 = aVar4;
  aVar4.m128 = (__m128)minps(aVar2.m128,b->bounds0[0].bounds1.lower.field_0);
  __return_storage_ptr__->bounds0[0].bounds1.lower.field_0 = aVar4;
  aVar4.m128 = (__m128)maxps(__return_storage_ptr__->bounds0[0].bounds1.upper.field_0,
                             b->bounds0[0].bounds1.upper.field_0);
  __return_storage_ptr__->bounds0[0].bounds1.upper.field_0 = aVar4;
  aVar4.m128 = (__m128)minps(__return_storage_ptr__->bounds1[0].bounds0.lower.field_0,
                             b->bounds1[0].bounds0.lower.field_0);
  __return_storage_ptr__->bounds1[0].bounds0.lower.field_0 = aVar4;
  aVar4.m128 = (__m128)maxps(__return_storage_ptr__->bounds1[0].bounds0.upper.field_0,
                             b->bounds1[0].bounds0.upper.field_0);
  __return_storage_ptr__->bounds1[0].bounds0.upper.field_0 = aVar4;
  aVar4.m128 = (__m128)minps(__return_storage_ptr__->bounds1[0].bounds1.lower.field_0,
                             b->bounds1[0].bounds1.lower.field_0);
  __return_storage_ptr__->bounds1[0].bounds1.lower.field_0 = aVar4;
  aVar4.m128 = (__m128)maxps(__return_storage_ptr__->bounds1[0].bounds1.upper.field_0,
                             b->bounds1[0].bounds1.upper.field_0);
  __return_storage_ptr__->bounds1[0].bounds1.upper.field_0 = aVar4;
  return __return_storage_ptr__;
}

Assistant:

static __forceinline const TemporalBinInfo merge2(const TemporalBinInfo& a, const TemporalBinInfo& b) {
            TemporalBinInfo r = a; r.merge(b); return r;
          }